

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

void __thiscall pbrt::AtomicFloat::Add(AtomicFloat *this,float v)

{
  memory_order mVar1;
  memory_order mVar2;
  memory_order *in_RDI;
  FloatBits newBits;
  FloatBits oldBits;
  memory_order in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  memory_order local_50 [4];
  undefined4 local_40;
  memory_order local_3c;
  memory_order *local_38;
  bool local_21;
  memory_order local_20;
  memory_order local_1c;
  undefined4 local_18;
  memory_order local_14;
  memory_order *local_10;
  
  local_50[0] = std::__atomic_base::operator_cast_to_unsigned_int
                          ((__atomic_base<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  do {
    BitsToFloat(0);
    mVar1 = FloatToBits(0.0);
    local_40 = 5;
    local_3c = mVar1;
    local_38 = local_50;
    local_1c = std::__cmpexch_failure_order(in_stack_fffffffffffffef4);
    local_18 = 5;
    switch(0x5f6b62) {
    default:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      else {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      break;
    case 2:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      else {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      break;
    case 3:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      else {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      break;
    case 4:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        in_stack_fffffffffffffef4 = *in_RDI;
        local_21 = local_50[0] == in_stack_fffffffffffffef4;
        if (local_21) {
          *in_RDI = mVar1;
          in_stack_fffffffffffffef4 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = in_stack_fffffffffffffef4;
        }
      }
      else {
        LOCK();
        mVar2 = *in_RDI;
        local_21 = local_50[0] == mVar2;
        if (local_21) {
          *in_RDI = mVar1;
          mVar2 = local_50[0];
        }
        UNLOCK();
        if (!local_21) {
          local_50[0] = mVar2;
        }
      }
    }
    local_20 = mVar1;
    local_14 = mVar1;
    local_10 = local_50;
  } while (((local_21 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

PBRT_CPU_GPU
    void Add(float v) {
#ifdef PBRT_IS_GPU_CODE
        atomicAdd(&value, v);
#else
        FloatBits oldBits = bits, newBits;
        do {
            newBits = FloatToBits(BitsToFloat(oldBits) + v);
        } while (!bits.compare_exchange_weak(oldBits, newBits));
#endif
    }